

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# most_common_helper.hpp
# Opt level: O2

multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
* flip_map<long,unsigned_int>
            (multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>
             *__return_storage_ptr__,
            map<long,_unsigned_int,_std::less<long>,_std::allocator<std::pair<const_long,_unsigned_int>_>_>
            *src)

{
  _Rb_tree_header *p_Var1;
  insert_iterator<std::multimap<unsigned_int,_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_long>_>_>_>
  __result;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __result.iter._M_node = &p_Var1->_M_header;
  __result.container = __return_storage_ptr__;
  std::
  transform<std::_Rb_tree_const_iterator<std::pair<long_const,unsigned_int>>,std::insert_iterator<std::multimap<unsigned_int,long,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,long>>>>,std::pair<unsigned_int,long>(*)(std::pair<long,unsigned_int>const&)>
            ((src->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_long,_unsigned_int>_>)
             &(src->_M_t)._M_impl.super__Rb_tree_header,__result,flip_pair<long,unsigned_int>);
  return __return_storage_ptr__;
}

Assistant:

std::multimap<B,A> flip_map(const std::map<A,B> &src)
{
    std::multimap<B,A> dst;
    std::transform(src.begin(), src.end(), std::inserter(dst, dst.begin()),
                   flip_pair<A,B>);
    return dst;
}